

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy_io.c
# Opt level: O1

void http_proxy_io_destroy(CONCRETE_IO_HANDLE http_proxy_io)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (http_proxy_io != (CONCRETE_IO_HANDLE)0x0) {
    if (*(void **)((long)http_proxy_io + 0x80) != (void *)0x0) {
      free(*(void **)((long)http_proxy_io + 0x80));
    }
    xio_destroy(*(XIO_HANDLE *)((long)http_proxy_io + 0x78));
    free(*(void **)((long)http_proxy_io + 0x48));
    free(*(void **)((long)http_proxy_io + 0x58));
    free(*(void **)((long)http_proxy_io + 0x68));
    free(*(void **)((long)http_proxy_io + 0x70));
    free(http_proxy_io);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
               ,"http_proxy_io_destroy",0xd2,1,"NULL http_proxy_io.");
    return;
  }
  return;
}

Assistant:

static void http_proxy_io_destroy(CONCRETE_IO_HANDLE http_proxy_io)
{
    if (http_proxy_io == NULL)
    {
        /* Codes_SRS_HTTP_PROXY_IO_01_014: [ If http_proxy_io is NULL, http_proxy_io_destroy shall do nothing. ]*/
        LogError("NULL http_proxy_io.");
    }
    else
    {
        HTTP_PROXY_IO_INSTANCE* http_proxy_io_instance = (HTTP_PROXY_IO_INSTANCE*)http_proxy_io;

        /* Codes_SRS_HTTP_PROXY_IO_01_013: [ http_proxy_io_destroy shall free the HTTP proxy IO instance indicated by http_proxy_io. ]*/
        if (http_proxy_io_instance->receive_buffer != NULL)
        {
            free(http_proxy_io_instance->receive_buffer);
        }

        /* Codes_SRS_HTTP_PROXY_IO_01_016: [ http_proxy_io_destroy shall destroy the underlying IO created in http_proxy_io_create by calling xio_destroy. ]*/
        xio_destroy(http_proxy_io_instance->underlying_io);
        free(http_proxy_io_instance->hostname);
        free(http_proxy_io_instance->proxy_hostname);
        free(http_proxy_io_instance->username);
        free(http_proxy_io_instance->password);
        free(http_proxy_io_instance);
    }
}